

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  pointer pcVar1;
  initializer_list<int> __l;
  Parser parser;
  NeuralNetwork nn;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  test_y;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  test_x;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  train_y;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  train_x;
  Parser local_e2;
  allocator_type local_e1;
  undefined1 local_e0 [40];
  vector<Layer,_std::allocator<Layer>_> local_b8;
  vector<int,_std::allocator<int>_> local_a0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_88;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_70;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_58;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_40;
  int local_28 [6];
  
  std::ios_base::sync_with_stdio(false);
  pcVar1 = local_e0 + 0x10;
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e0,"../data/train-images-idx3-ubyte","");
  Parser::parse_features(&local_40,&local_e2,(string *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e0,"../data/train-labels-idx1-ubyte","");
  Parser::parse_labels(&local_58,&local_e2,(string *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e0,"../data/t10k-images-idx3-ubyte","");
  Parser::parse_features(&local_70,&local_e2,(string *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e0,"../data/t10k-labels-idx1-ubyte","");
  Parser::parse_labels(&local_88,&local_e2,(string *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  local_28[0] = 0x310;
  local_28[1] = 100;
  local_28[2] = 0x32;
  local_28[3] = 10;
  __l._M_len = 4;
  __l._M_array = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l,&local_e1);
  NeuralNetwork::NeuralNetwork((NeuralNetwork *)local_e0,&local_a0,0.005,0x1e,0x32,relu,derive_relu)
  ;
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  NeuralNetwork::train((NeuralNetwork *)local_e0,&local_40,&local_58,&local_70,&local_88);
  std::vector<Layer,_std::allocator<Layer>_>::~vector(&local_b8);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_70);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_40);
  return 0;
}

Assistant:

int main(int, char**) {
    std::ios::sync_with_stdio(false);
    Parser parser;
    using namespace std;
    // MNIST数据集
    auto train_x = parser.parse_features("../data/train-images-idx3-ubyte");
    auto train_y = parser.parse_labels("../data/train-labels-idx1-ubyte");
    auto test_x = parser.parse_features("../data/t10k-images-idx3-ubyte");
    auto test_y = parser.parse_labels("../data/t10k-labels-idx1-ubyte");
    //参数{28 * 28, 50, 10}表示构建一个三层的神经网络，其中
    //输入层是28*28=784个节点，隐层是50个节点，输出层是10个节点，隐层数量可以增加，第一个和最后一个总是表示输入层和输出层的节点数量
    NeuralNetwork nn({28 * 28, 100,50, 10}, 0.005, 30, 50, &relu, &derive_relu);
    // NeuralNetwork nn({28 * 28, 150, 10}, 0.005, 30, 20);
    nn.train(train_x, train_y, test_x, test_y);

    return 0;
}